

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O0

void __thiscall OpenMD::AngleR::process(AngleR *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  SnapshotManager *this_00;
  Snapshot *pSVar5;
  reference pvVar6;
  reference pvVar7;
  long in_RDI;
  Thermo *pTVar8;
  double dVar9;
  SimInfo *pSVar10;
  int whichBin_2;
  RealType cosangle_2;
  Vector3d vec_2;
  Vector3d rc_1;
  Vector3d r2_1;
  Vector3d r1_2;
  int whichBin_1;
  RealType cosangle_1;
  Vector3d vec_1;
  Vector3d rc;
  Vector3d r2;
  int sd2Index;
  StuntDouble *sd1A;
  int sd1Aind;
  Vector3d r1_1;
  int whichBin;
  RealType cosangle;
  Vector3d vec;
  Vector3d r1;
  Vector3d pos;
  Vector3d CenterOfMass;
  int istep;
  int nFrames;
  DumpReader reader;
  Thermo thermo;
  bool usePeriodicBoundaryConditions_;
  RealType distance;
  int jj;
  int ii;
  StuntDouble *sd2;
  StuntDouble *sd1;
  StuntDouble *in_stack_ffffffffffffe818;
  DumpReader *in_stack_ffffffffffffe820;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffe828;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffe830;
  undefined7 in_stack_ffffffffffffe840;
  undefined1 in_stack_ffffffffffffe847;
  StuntDouble *in_stack_ffffffffffffe848;
  DumpReader *in_stack_ffffffffffffe850;
  errorStruct *in_stack_ffffffffffffe858;
  StuntDouble *in_stack_ffffffffffffe898;
  undefined4 in_stack_ffffffffffffe8a0;
  int in_stack_ffffffffffffe8a4;
  StuntDouble *in_stack_ffffffffffffe8a8;
  undefined4 in_stack_ffffffffffffe8b0;
  int in_stack_ffffffffffffe8b4;
  Thermo *in_stack_ffffffffffffe8c8;
  string *in_stack_ffffffffffffea70;
  SimInfo *in_stack_ffffffffffffea78;
  DumpReader *in_stack_ffffffffffffea80;
  AngleR *in_stack_ffffffffffffeb30;
  uint local_12f0;
  Thermo local_38;
  byte local_29;
  double local_28;
  StuntDouble *local_18;
  DumpReader *local_10;
  
  SimInfo::getSimParams(*(SimInfo **)(in_RDI + 8));
  local_29 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x1321c0);
  Thermo::Thermo(&local_38,*(SimInfo **)(in_RDI + 8));
  DumpReader::DumpReader
            (in_stack_ffffffffffffea80,in_stack_ffffffffffffea78,in_stack_ffffffffffffea70);
  iVar2 = DumpReader::getNFrames(in_stack_ffffffffffffe820);
  *(int *)(in_RDI + 0xd50) = iVar2 / *(int *)(in_RDI + 0x30);
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe818);
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe818);
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,(double *)in_stack_ffffffffffffe820
            );
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe818);
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe818);
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_stack_ffffffffffffe830,in_stack_ffffffffffffe828,(double *)in_stack_ffffffffffffe820
            );
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe818);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe818);
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_ffffffffffffe830._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_ffffffffffffe828._M_current,(int *)in_stack_ffffffffffffe820);
  for (local_12f0 = 0; (int)local_12f0 < iVar2; local_12f0 = *(int *)(in_RDI + 0x30) + local_12f0) {
    DumpReader::readFrame
              ((DumpReader *)CONCAT44(in_stack_ffffffffffffe8b4,in_stack_ffffffffffffe8b0),
               (int)((ulong)in_stack_ffffffffffffe8a8 >> 0x20));
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    pSVar5 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)(in_RDI + 200) = pSVar5;
    Thermo::getCom(in_stack_ffffffffffffe8c8);
    bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x2a8));
    if (bVar1) {
      SelectionEvaluator::evaluate((SelectionEvaluator *)in_stack_ffffffffffffe858);
      SelectionManager::setSelectionSet
                ((SelectionManager *)in_stack_ffffffffffffe830._M_current,
                 (SelectionSet *)in_stack_ffffffffffffe828._M_current);
      SelectionSet::~SelectionSet((SelectionSet *)0x13247e);
    }
    if ((*(byte *)(in_RDI + 0xd0) & 1) == 0) {
      if ((*(byte *)(in_RDI + 0xd1) & 1) == 0) {
        bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x7f8));
        if (bVar1) {
          SelectionEvaluator::evaluate((SelectionEvaluator *)in_stack_ffffffffffffe858);
          SelectionManager::setSelectionSet
                    ((SelectionManager *)in_stack_ffffffffffffe830._M_current,
                     (SelectionSet *)in_stack_ffffffffffffe828._M_current);
          SelectionSet::~SelectionSet((SelectionSet *)0x132cbd);
        }
        iVar3 = SelectionManager::getSelectionCount((SelectionManager *)0x132cf9);
        iVar4 = SelectionManager::getSelectionCount((SelectionManager *)0x132d13);
        if (iVar3 != iVar4) {
          in_stack_ffffffffffffe858 = &painCave;
          snprintf(painCave.errMsg,2000,
                   "In frame %d, the number of selected StuntDoubles are\n\tnot the same in --sele1 and sele2\n"
                   ,(ulong)local_12f0);
          *(undefined4 *)((long)((SelectionCompiler *)in_stack_ffffffffffffe858->errMsg + 6) + 0x84)
               = 3;
          *(undefined4 *)((long)((SelectionCompiler *)in_stack_ffffffffffffe858->errMsg + 6) + 0x80)
               = 0;
          simError();
        }
        in_stack_ffffffffffffe850 =
             (DumpReader *)
             SelectionManager::beginSelected
                       ((SelectionManager *)in_stack_ffffffffffffe830._M_current,
                        (int *)in_stack_ffffffffffffe828._M_current);
        local_10 = in_stack_ffffffffffffe850;
        in_stack_ffffffffffffe848 =
             SelectionManager::beginSelected
                       ((SelectionManager *)in_stack_ffffffffffffe830._M_current,
                        (int *)in_stack_ffffffffffffe828._M_current);
        local_18 = in_stack_ffffffffffffe848;
        while (in_stack_ffffffffffffe847 =
                    local_10 != (DumpReader *)0x0 && local_18 != (StuntDouble *)0x0,
              local_10 != (DumpReader *)0x0 && local_18 != (StuntDouble *)0x0) {
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe828._M_current);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe820);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_ffffffffffffe820,
                     (Vector<double,_3U> *)in_stack_ffffffffffffe818);
          if ((local_29 & 1) != 0) {
            Snapshot::wrapVector
                      ((Snapshot *)CONCAT44(in_stack_ffffffffffffe8a4,in_stack_ffffffffffffe8a0),
                       (Vector3d *)in_stack_ffffffffffffe898);
          }
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe828._M_current);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe820);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_ffffffffffffe820,
                     (Vector<double,_3U> *)in_stack_ffffffffffffe818);
          if ((local_29 & 1) != 0) {
            Snapshot::wrapVector
                      ((Snapshot *)CONCAT44(in_stack_ffffffffffffe8a4,in_stack_ffffffffffffe8a0),
                       (Vector3d *)in_stack_ffffffffffffe898);
          }
          OpenMD::operator+((Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe820);
          OpenMD::operator*((double)in_stack_ffffffffffffe828._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe820);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_ffffffffffffe820,
                     (Vector<double,_3U> *)in_stack_ffffffffffffe818);
          if ((local_29 & 1) != 0) {
            Snapshot::wrapVector
                      ((Snapshot *)CONCAT44(in_stack_ffffffffffffe8a4,in_stack_ffffffffffffe8a0),
                       (Vector3d *)in_stack_ffffffffffffe898);
          }
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe820);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_ffffffffffffe820,
                     (Vector<double,_3U> *)in_stack_ffffffffffffe818);
          if ((local_29 & 1) != 0) {
            Snapshot::wrapVector
                      ((Snapshot *)CONCAT44(in_stack_ffffffffffffe8a4,in_stack_ffffffffffffe8a0),
                       (Vector3d *)in_stack_ffffffffffffe898);
          }
          local_28 = Vector<double,_3U>::length((Vector<double,_3U> *)0x132fd5);
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffe820);
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffe820);
          pSVar10 = (SimInfo *)
                    dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffe830._M_current,
                                   (Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current);
          in_stack_ffffffffffffe830._M_current = (double *)pSVar10;
          if (local_28 < *(double *)(in_RDI + 0xd58)) {
            iVar3 = (int)(local_28 / *(double *)(in_RDI + 0xd68));
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd70),
                                (long)iVar3);
            *pvVar6 = (double)pSVar10 + *pvVar6;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xda0),(long)iVar3);
            *pvVar7 = *pvVar7 + 1;
            in_stack_ffffffffffffe828._M_current = (double *)pSVar10;
          }
          in_stack_ffffffffffffe820 =
               (DumpReader *)
               SelectionManager::nextSelected
                         ((SelectionManager *)in_stack_ffffffffffffe830._M_current,
                          (int *)in_stack_ffffffffffffe828._M_current);
          local_10 = in_stack_ffffffffffffe820;
          in_stack_ffffffffffffe818 =
               SelectionManager::nextSelected
                         ((SelectionManager *)in_stack_ffffffffffffe830._M_current,
                          (int *)in_stack_ffffffffffffe828._M_current);
          local_18 = in_stack_ffffffffffffe818;
        }
      }
      else {
        local_10 = (DumpReader *)
                   SelectionManager::beginSelected
                             ((SelectionManager *)in_stack_ffffffffffffe830._M_current,
                              (int *)in_stack_ffffffffffffe828._M_current);
        while (local_10 != (DumpReader *)0x0) {
          Vector3<double>::Vector3((Vector3<double> *)0x13281a);
          if ((*(byte *)(in_RDI + 0xd2) & 1) == 0) {
            StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe828._M_current);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current,
                              (Vector<double,_3U> *)in_stack_ffffffffffffe820);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffe828._M_current,
                       (Vector<double,_3U> *)in_stack_ffffffffffffe820);
          }
          else {
            in_stack_ffffffffffffe8b4 = StuntDouble::getGlobalIndex((StuntDouble *)local_10);
            in_stack_ffffffffffffe8a8 =
                 SimInfo::getIOIndexToIntegrableObject
                           ((SimInfo *)in_stack_ffffffffffffe828._M_current,
                            (int)((ulong)in_stack_ffffffffffffe820 >> 0x20));
            StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe828._M_current);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current,
                              (Vector<double,_3U> *)in_stack_ffffffffffffe820);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffe828._M_current,
                       (Vector<double,_3U> *)in_stack_ffffffffffffe820);
          }
          if ((local_29 & 1) != 0) {
            Snapshot::wrapVector
                      ((Snapshot *)CONCAT44(in_stack_ffffffffffffe8a4,in_stack_ffffffffffffe8a0),
                       (Vector3d *)in_stack_ffffffffffffe898);
          }
          in_stack_ffffffffffffe8a4 = StuntDouble::getGlobalIndex((StuntDouble *)local_10);
          in_stack_ffffffffffffe898 =
               SimInfo::getIOIndexToIntegrableObject
                         ((SimInfo *)in_stack_ffffffffffffe828._M_current,
                          (int)((ulong)in_stack_ffffffffffffe820 >> 0x20));
          local_18 = in_stack_ffffffffffffe898;
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe828._M_current);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe820);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_ffffffffffffe820,
                     (Vector<double,_3U> *)in_stack_ffffffffffffe818);
          if ((local_29 & 1) != 0) {
            Snapshot::wrapVector
                      ((Snapshot *)CONCAT44(in_stack_ffffffffffffe8a4,in_stack_ffffffffffffe8a0),
                       (Vector3d *)in_stack_ffffffffffffe898);
          }
          OpenMD::operator+((Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe820);
          OpenMD::operator*((double)in_stack_ffffffffffffe828._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe820);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_ffffffffffffe820,
                     (Vector<double,_3U> *)in_stack_ffffffffffffe818);
          if ((local_29 & 1) != 0) {
            Snapshot::wrapVector
                      ((Snapshot *)CONCAT44(in_stack_ffffffffffffe8a4,in_stack_ffffffffffffe8a0),
                       (Vector3d *)in_stack_ffffffffffffe898);
          }
          local_28 = Vector<double,_3U>::length((Vector<double,_3U> *)0x132ab8);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe820);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_ffffffffffffe820,
                     (Vector<double,_3U> *)in_stack_ffffffffffffe818);
          if ((local_29 & 1) != 0) {
            Snapshot::wrapVector
                      ((Snapshot *)CONCAT44(in_stack_ffffffffffffe8a4,in_stack_ffffffffffffe8a0),
                       (Vector3d *)in_stack_ffffffffffffe898);
          }
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffe820);
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffe820);
          dVar9 = dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffe830._M_current,
                                 (Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current);
          if (local_28 < *(double *)(in_RDI + 0xd58)) {
            iVar3 = (int)(local_28 / *(double *)(in_RDI + 0xd68));
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd70),
                                (long)iVar3);
            *pvVar6 = dVar9 + *pvVar6;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xda0),(long)iVar3);
            *pvVar7 = *pvVar7 + 1;
          }
          local_10 = (DumpReader *)
                     SelectionManager::nextSelected
                               ((SelectionManager *)in_stack_ffffffffffffe830._M_current,
                                (int *)in_stack_ffffffffffffe828._M_current);
        }
      }
    }
    else {
      local_10 = (DumpReader *)
                 SelectionManager::beginSelected
                           ((SelectionManager *)in_stack_ffffffffffffe830._M_current,
                            (int *)in_stack_ffffffffffffe828._M_current);
      while (local_10 != (DumpReader *)0x0) {
        StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe828._M_current);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current,
                          (Vector<double,_3U> *)in_stack_ffffffffffffe820);
        Vector3<double>::Vector3
                  ((Vector3<double> *)in_stack_ffffffffffffe820,
                   (Vector<double,_3U> *)in_stack_ffffffffffffe818);
        local_28 = Vector<double,_3U>::length((Vector<double,_3U> *)0x132573);
        bVar1 = StuntDouble::isDirectional((StuntDouble *)in_stack_ffffffffffffe820);
        if (bVar1) {
          StuntDouble::getA((StuntDouble *)in_stack_ffffffffffffe828._M_current);
          SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_ffffffffffffe858);
          OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_ffffffffffffe848,
                            (Vector<double,_3U> *)
                            CONCAT17(in_stack_ffffffffffffe847,in_stack_ffffffffffffe840));
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_ffffffffffffe820,
                     (Vector<double,_3U> *)in_stack_ffffffffffffe818);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x132626);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x132633);
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffe820);
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffe820);
          pTVar8 = (Thermo *)
                   dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffe830._M_current,
                                  (Vector<double,_3U> *)in_stack_ffffffffffffe828._M_current);
          if (local_28 < *(double *)(in_RDI + 0xd58)) {
            iVar3 = (int)(local_28 / *(double *)(in_RDI + 0xd68));
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd70),
                                (long)iVar3);
            *pvVar6 = (double)pTVar8 + *pvVar6;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xda0),(long)iVar3);
            *pvVar7 = *pvVar7 + 1;
            in_stack_ffffffffffffe8c8 = pTVar8;
          }
        }
        local_10 = (DumpReader *)
                   SelectionManager::nextSelected
                             ((SelectionManager *)in_stack_ffffffffffffe830._M_current,
                              (int *)in_stack_ffffffffffffe828._M_current);
      }
    }
  }
  processHistogram((AngleR *)in_stack_ffffffffffffe850);
  writeAngleR(in_stack_ffffffffffffeb30);
  DumpReader::~DumpReader(in_stack_ffffffffffffe820);
  return;
}

Assistant:

void AngleR::process() {
    StuntDouble* sd1;
    StuntDouble* sd2;
    int ii;
    int jj;
    RealType distance;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    Thermo thermo(info_);
    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    nProcessed_ = nFrames / step_;

    std::fill(avgAngleR_.begin(), avgAngleR_.end(), 0.0);
    std::fill(histogram_.begin(), histogram_.end(), 0.0);
    std::fill(count_.begin(), count_.end(), 0);

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Vector3d CenterOfMass = thermo.getCom();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (doVect_) {
        for (sd1 = seleMan1_.beginSelected(ii); sd1 != NULL;
             sd1 = seleMan1_.nextSelected(ii)) {
          Vector3d pos = sd1->getPos();

          Vector3d r1 = CenterOfMass - pos;
          distance    = r1.length();
          // only do this if the stunt double actually has a vector associated
          // with it
          if (sd1->isDirectional()) {
            Vector3d vec = sd1->getA().transpose() * V3Z;
            vec.normalize();
            r1.normalize();
            RealType cosangle = dot(r1, vec);

            if (distance < len_) {
              int whichBin = int(distance / deltaR_);
              histogram_[whichBin] += cosangle;
              count_[whichBin] += 1;
            }
          }
        }
      } else {
        if (doOffset_) {
          for (sd1 = seleMan1_.beginSelected(ii); sd1 != NULL;
               sd1 = seleMan1_.nextSelected(ii)) {
            // This will require careful rewriting if StaticProps is
            // ever parallelized.  For an example, see
            // Thermo::getTaggedAtomPairDistance
            Vector3d r1;

            if (doOffset2_) {
              int sd1Aind       = sd1->getGlobalIndex() + seleOffset2_;
              StuntDouble* sd1A = info_->getIOIndexToIntegrableObject(sd1Aind);
              r1                = CenterOfMass - sd1A->getPos();
            } else {
              r1 = CenterOfMass - sd1->getPos();
            }

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(r1);

            int sd2Index = sd1->getGlobalIndex() + seleOffset_;
            sd2          = info_->getIOIndexToIntegrableObject(sd2Index);

            Vector3d r2 = CenterOfMass - sd2->getPos();
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(r1);

            Vector3d rc = 0.5 * (r1 + r2);
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rc);

            distance = rc.length();

            Vector3d vec = r1 - r2;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            rc.normalize();
            vec.normalize();
            RealType cosangle = dot(rc, vec);
            if (distance < len_) {
              int whichBin = int(distance / deltaR_);
              histogram_[whichBin] += cosangle;
              count_[whichBin] += 1;
            }
          }
        } else {
          if (evaluator2_.isDynamic()) {
            seleMan2_.setSelectionSet(evaluator2_.evaluate());
          }

          if (seleMan1_.getSelectionCount() != seleMan2_.getSelectionCount()) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "In frame %d, the number of selected StuntDoubles are\n"
                     "\tnot the same in --sele1 and sele2\n",
                     istep);
            painCave.severity = OPENMD_INFO;
            painCave.isFatal  = 0;
            simError();
          }

          for (sd1                             = seleMan1_.beginSelected(ii),
              sd2                              = seleMan2_.beginSelected(jj);
               sd1 != NULL && sd2 != NULL; sd1 = seleMan1_.nextSelected(ii),
              sd2                              = seleMan2_.nextSelected(jj)) {
            Vector3d r1 = CenterOfMass - sd1->getPos();
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(r1);

            Vector3d r2 = CenterOfMass - sd2->getPos();
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(r1);

            Vector3d rc = 0.5 * (r1 + r2);
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rc);

            Vector3d vec = r1 - r2;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            distance = rc.length();

            rc.normalize();
            vec.normalize();
            RealType cosangle = dot(rc, vec);
            if (distance < len_) {
              int whichBin = int(distance / deltaR_);
              histogram_[whichBin] += cosangle;
              count_[whichBin] += 1;
            }
          }
        }
      }
    }
    processHistogram();
    writeAngleR();
  }